

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O2

double asind(double v)

{
  double dVar1;
  
  if (v <= -1.0) {
    if (-1e-10 < v + 1.0) {
      return -90.0;
    }
  }
  else {
    if ((v == 0.0) && (!NAN(v))) {
      return 0.0;
    }
    if ((1.0 <= v) && (v + -1.0 < 1e-10)) {
      return 90.0;
    }
  }
  dVar1 = asin(v);
  return dVar1 * 57.29577951308232;
}

Assistant:

double asind(double v) {
    if (v <= -1.0) {
        if (v + 1.0 > -TRIG_TOL)
            return -90.0;
    } else if (v == 0.0) {
        return 0.0;
    } else if (v >= 1.0) {
        if (v - 1.0 < TRIG_TOL)
            return 90.0;
    }

    return asin(v) * R2D;
}